

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t read_body_to_string(archive_read *a,tar *tar,archive_string *as,void *h,size_t *unconsumed)

{
  archive_string *as_00;
  archive_string *paVar1;
  void *__src;
  archive_read *in_RCX;
  long *in_RDX;
  archive *in_RDI;
  ulong *in_R8;
  void *src;
  archive_entry_header_ustar *header;
  int64_t size;
  size_t *in_stack_ffffffffffffffb8;
  wchar_t local_4;
  
  as_00 = (archive_string *)tar_atol((char *)in_stack_ffffffffffffffb8,0x15069a);
  if (((long)as_00 < 0x100001) && (-1 < (long)as_00)) {
    paVar1 = archive_string_ensure(as_00,(size_t)in_RCX);
    if (paVar1 == (archive_string *)0x0) {
      archive_set_error(in_RDI,0xc,"No memory");
      local_4 = L'\xffffffe2';
    }
    else {
      tar_flush_unconsumed(in_RCX,in_stack_ffffffffffffffb8);
      *in_R8 = (ulong)((long)&as_00[0x15].s + 7) & 0xfffffffffffffe00;
      __src = __archive_read_ahead(in_RCX,(size_t)in_stack_ffffffffffffffb8,(ssize_t *)0x150755);
      if (__src == (void *)0x0) {
        *in_R8 = 0;
        local_4 = L'\xffffffe2';
      }
      else {
        memcpy((void *)*in_RDX,__src,(size_t)as_00);
        *(undefined1 *)((long)&as_00->s + *in_RDX) = 0;
        in_RDX[1] = (long)as_00;
        local_4 = L'\0';
      }
    }
  }
  else {
    archive_set_error(in_RDI,0x16,"Special header too large");
    local_4 = L'\xffffffe2';
  }
  return local_4;
}

Assistant:

static int
read_body_to_string(struct archive_read *a, struct tar *tar,
    struct archive_string *as, const void *h, size_t *unconsumed)
{
	int64_t size;
	const struct archive_entry_header_ustar *header;
	const void *src;

	(void)tar; /* UNUSED */
	header = (const struct archive_entry_header_ustar *)h;
	size  = tar_atol(header->size, sizeof(header->size));
	if ((size > 1048576) || (size < 0)) {
		archive_set_error(&a->archive, EINVAL,
		    "Special header too large");
		return (ARCHIVE_FATAL);
	}

	/* Fail if we can't make our buffer big enough. */
	if (archive_string_ensure(as, (size_t)size+1) == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory");
		return (ARCHIVE_FATAL);
	}

	tar_flush_unconsumed(a, unconsumed);

	/* Read the body into the string. */
	*unconsumed = (size_t)((size + 511) & ~ 511);
	src = __archive_read_ahead(a, *unconsumed, NULL);
	if (src == NULL) {
		*unconsumed = 0;
		return (ARCHIVE_FATAL);
	}
	memcpy(as->s, src, (size_t)size);
	as->s[size] = '\0';
	as->length = (size_t)size;
	return (ARCHIVE_OK);
}